

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O3

string * slack::_detail::join<slack::_detail::Element>
                   (string *__return_storage_ptr__,
                   vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *vec,
                   string *sep)

{
  pointer pEVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  stringstream ss;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pEVar1 = (vec->
           super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>).
      _M_impl.super__Vector_impl_data._M_finish == pEVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(pEVar1->label)._M_dataplus._M_p,(pEVar1->label)._M_string_length)
    ;
    local_1c1 = '=';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1c1,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(pEVar1->value)._M_dataplus._M_p,(pEVar1->value)._M_string_length);
    local_1c0 = __return_storage_ptr__;
    if (0x40 < (ulong)((long)(vec->
                             super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      uVar4 = 1;
      lVar3 = 0x68;
      do {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(sep->_M_dataplus)._M_p,sep->_M_string_length);
        pEVar1 = (vec->
                 super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,*(char **)((long)pEVar1 + lVar3 + -0x28),
                            *(long *)((long)pEVar1 + lVar3 + -0x20));
        local_1c1 = '=';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1c1,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)((long)pEVar1 + lVar3 + -8),
                   *(long *)((long)&(pEVar1->label)._M_dataplus._M_p + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar4 < (ulong)((long)(vec->
                                     super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vec->
                                     super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    __return_storage_ptr__ = local_1c0;
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string join(const std::vector<T>& vec, const std::string& sep) {
    std::stringstream ss;
    if (vec.size() == 0) { return ""; };
    ss << vec[0];
    for (size_t i = 1; i < vec.size(); i ++) { ss << sep << vec[i]; }
    return ss.str();
}